

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_property.c
# Opt level: O0

int mpt_text_get(mpt_text *tx,mpt_property *pr)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int type_1;
  char *elem_name [7];
  int local_28;
  int pos;
  int type;
  mpt_property *pr_local;
  mpt_text *tx_local;
  
  if (pr == (mpt_property *)0x0) {
    iVar1 = mpt_text_pointer_typeid();
    return iVar1;
  }
  if (pr->name == (char *)0x0) {
    local_28 = (int)pr->desc;
    if ((local_28 < 0) || (6 < local_28)) {
      return -1;
    }
  }
  else {
    if (*pr->name == '\0') {
      pr->name = "text";
      pr->desc = "mpt text data";
      (pr->val)._addr = mpt_text_get::format;
      (pr->val)._type = 0;
      if (((mpt_text_get::format[2] == '\0') && (iVar1 = mpt_color_typeid(), 0 < iVar1)) &&
         (iVar1 < 0x100)) {
        mpt_text_get::format[2] = (uint8_t)iVar1;
      }
      bVar3 = false;
      if (tx != (mpt_text *)0x0) {
        iVar1 = memcmp(tx,&def_text,0x28);
        bVar3 = iVar1 != 0;
      }
      return (uint)bVar3;
    }
    if (pr->name[1] == '\0') {
      if (*pr->name == 'x') {
        mpt_text_get::from = mpt_text_get::elem_xy;
        bVar3 = false;
        if (tx != (mpt_text *)0x0) {
          bVar3 = (tx->pos).x == 0.5;
        }
        local_28 = 0;
        if (bVar3) {
          local_28 = 100;
        }
      }
      else {
        if (*pr->name != 'y') {
          return -1;
        }
        mpt_text_get::from = mpt_text_get::elem_xy + 1;
        bVar3 = false;
        if (tx != (mpt_text *)0x0) {
          bVar3 = (tx->pos).x == 0.5;
        }
        local_28 = 0;
        if (bVar3) {
          local_28 = 100;
        }
      }
      pr->name = mpt_text_get::from->name;
      pr->desc = mpt_text_get::from->desc;
      (pr->val)._addr = (void *)((long)&tx->_value + mpt_text_get::from->off);
      (pr->val)._type = (long)mpt_text_get::from->type;
      return local_28;
    }
    for (local_28 = 0; local_28 < 7; local_28 = local_28 + 1) {
      elem_name[(long)local_28 + -1] = mpt_text_get::elem[local_28].name;
    }
    local_28 = mpt_property_match(pr->name,0xffffffff,&stack0xffffffffffffff98,(long)local_28);
    if (local_28 < 0) {
      return local_28;
    }
  }
  iVar1 = mpt_text_get::elem[local_28].type;
  if (iVar1 < 0) {
    if (mpt_text_get::elem[local_28].type == -1) {
      iVar2 = mpt_color_typeid();
      if (iVar2 < 1) {
        return -4;
      }
    }
    else {
      if (mpt_text_get::elem[local_28].type != -2) {
        return -1;
      }
      iVar2 = mpt_fpoint_typeid();
      if (iVar2 < 1) {
        return -4;
      }
    }
  }
  pr->name = mpt_text_get::elem[local_28].name;
  pr->desc = mpt_text_get::elem[local_28].desc;
  (pr->val)._addr = (void *)((long)&tx->_value + mpt_text_get::elem[local_28].off);
  (pr->val)._type = (long)iVar1;
  if (tx == (mpt_text *)0x0) {
    tx_local._4_4_ = 0;
  }
  else {
    tx_local._4_4_ =
         mpt_value_compare(&pr->val,(long)&def_text._value + mpt_text_get::elem[local_28].off);
  }
  return tx_local._4_4_;
}

Assistant:

extern int mpt_text_get(const MPT_STRUCT(text) *tx, MPT_STRUCT(property) *pr)
{
	static const struct {
		const char  *name;
		const char  *desc;
		const int    type;
		const size_t off;
	} elem[] = {
		{"color",  "text color",     -1,  MPT_offset(text,color) },
		
		{"pos",    "text position",  -2,  MPT_offset(text, pos) },
		
		{"size",   "text size",      'y', MPT_offset(text,size) },
		{"align",  "text alignment", 'c', MPT_offset(text,align) },
		{"angle",  "text angle",     'd', MPT_offset(text,angle) },
		{"value",  "text data",      's', MPT_offset(text,_value) },
		{"font",   "text font",      's', MPT_offset(text,_font) },
	},
	elem_xy[] = {
		{"x", "x start position", 'f',  MPT_offset(text, pos.x) },
		{"y", "y start position", 'f',  MPT_offset(text, pos.y) }
	},
	*from;
	static uint8_t format[] = {
		's', 's',       /* value, font */
		0,              /* placeholder for dynamic color ID */
		'y', 'y', 'y',  /* font style, weight, size, */
		'c',            /* text alignment */
		'f', 'f',       /* position */
		'd',            /* angle */
		0
	};
	int type;
	int pos;
	
	if (!pr) {
		return mpt_text_pointer_typeid();
	}
	/* property by position */
	if (!pr->name) {
		pos = (intptr_t) pr->desc;
		if (pos < 0 || pos >= (int) MPT_arrsize(elem)) {
			return MPT_ERROR(BadArgument);
		}
	}
	/* get total type */
	else if (!*pr->name) {
		pr->name = "text";
		pr->desc = "mpt text data";
		MPT_value_set(&pr->val, 0, format);
		
		if (!format[2] && (type = mpt_color_typeid()) > 0 && type <= UINT8_MAX) {
			format[2] = type;
		}
		return tx && memcmp(tx, &def_text, sizeof(*tx)) ? 1 : 0;
	}
	/* set position independently */
	else if (!pr->name[1]) {
		if (pr->name[0] == 'x') {
			from = &elem_xy[0];
			pos = (tx && tx->pos.x == def_text.pos.x) ? 'd' : 0;
		}
		else if (pr->name[0] == 'y') {
			from = &elem_xy[1];
			pos = (tx && tx->pos.x == def_text.pos.x) ? 'd' : 0;
		}
		else {
			return MPT_ERROR(BadArgument);
		}
		
		pr->name = from->name;
		pr->desc = from->desc;
		
		MPT_value_set(&pr->val, from->type, ((uint8_t *) tx) + from->off);
		
		return pos;
	}
	/* find property by name */
	else {
		const char *elem_name[MPT_arrsize(elem)];
		for (pos = 0; pos < (int) MPT_arrsize(elem); pos++) {
			elem_name[pos] = elem[pos].name;
		}
		if ((pos = mpt_property_match(pr->name, -1, elem_name, pos)) < 0) {
			return pos;
		}
	}
	if ((type = elem[pos].type) < 0) {
		int type = elem[pos].type;
		if (type == -1) {
			if ((type = mpt_color_typeid()) <= 0) {
				return MPT_ERROR(BadOperation);
			}
		}
		else if (type == -2) {
			if ((type = mpt_fpoint_typeid()) <= 0) {
				return MPT_ERROR(BadOperation);
			}
		}
		else {
			return MPT_ERROR(BadArgument);
		}
	}
	
	pr->name = elem[pos].name;
	pr->desc = elem[pos].desc;
	MPT_value_set(&pr->val, type, ((uint8_t *) tx) + elem[pos].off);
	
	if (!tx) {
		return 0;
	}
	return mpt_value_compare(&pr->val, ((uint8_t *) &def_text) + elem[pos].off);
}